

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

UStringTrieResult __thiscall icu_63::BytesTrie::next(BytesTrie *this,char *s,int32_t sLength)

{
  byte bVar1;
  int iVar2;
  UStringTrieResult UVar3;
  char cVar4;
  uint inByte;
  int iVar5;
  byte *pos;
  byte *pbVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  
  if (sLength < 0) {
    if (*s == '\0') goto LAB_002f76fb;
  }
  else if (sLength == 0) {
LAB_002f76fb:
    UVar3 = current(this);
    return UVar3;
  }
  pos = this->pos_;
  if (pos == (byte *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  iVar5 = this->remainingMatchLength_;
  do {
    iVar2 = -1;
    if (iVar5 < -1) {
      iVar2 = iVar5;
    }
    pcVar9 = s;
    if (sLength < 0) {
      do {
        s = pcVar9 + 1;
        inByte = (uint)*pcVar9;
        if (*pcVar9 == '\0') {
          this->remainingMatchLength_ = iVar5;
          this->pos_ = pos;
          if (-1 < iVar5) {
            return USTRINGTRIE_NO_VALUE;
          }
LAB_002f7740:
          if (0x1f < *pos) {
            return *pos & USTRINGTRIE_NO_VALUE ^ USTRINGTRIE_INTERMEDIATE_VALUE;
          }
          return USTRINGTRIE_NO_VALUE;
        }
        if (iVar5 < 0) goto LAB_002f7660;
        if (inByte != *pos) goto LAB_002f770d;
        pos = pos + 1;
        iVar5 = iVar5 + -1;
        pcVar9 = s;
      } while( true );
    }
    lVar7 = 0;
    iVar8 = iVar5;
    while( true ) {
      if (sLength == (uint)lVar7) {
        pos = pos + (uint)sLength;
        this->remainingMatchLength_ = iVar5 - sLength;
        this->pos_ = pos;
        if (-1 < iVar5 - sLength) {
          return USTRINGTRIE_NO_VALUE;
        }
        goto LAB_002f7740;
      }
      inByte = (uint)s[lVar7];
      if (iVar8 < 0) break;
      if (inByte != pos[lVar7]) goto LAB_002f770d;
      iVar8 = iVar8 + -1;
      lVar7 = lVar7 + 1;
    }
    pos = pos + lVar7;
    sLength = sLength + ~(uint)lVar7;
    s = s + lVar7 + 1;
LAB_002f7660:
    this->remainingMatchLength_ = iVar2;
    while( true ) {
      while( true ) {
        pbVar6 = pos;
        pos = pbVar6 + 1;
        bVar1 = *pbVar6;
        if (0xf < bVar1) break;
        UVar3 = branchNext(this,pos,(uint)bVar1,inByte);
        if (UVar3 == USTRINGTRIE_NO_MATCH) {
          return USTRINGTRIE_NO_MATCH;
        }
        if (sLength < 0) {
          cVar4 = *s;
          if (cVar4 == '\0') {
            return UVar3;
          }
        }
        else {
          if (sLength == 0) {
            return UVar3;
          }
          cVar4 = *s;
          sLength = sLength - 1;
        }
        if (UVar3 == USTRINGTRIE_FINAL_VALUE) goto LAB_002f770d;
        inByte = (uint)cVar4;
        s = s + 1;
        pos = this->pos_;
      }
      if (bVar1 < 0x20) break;
      if ((bVar1 & 1) != 0) goto LAB_002f770d;
      if (0xa1 < bVar1) {
        if (bVar1 < 0xd8) {
          pos = pbVar6 + 2;
        }
        else if (bVar1 < 0xfc) {
          pos = pbVar6 + 3;
        }
        else {
          pos = pbVar6 + (ulong)((bVar1 >> 1 & 1) != 0) + 4;
        }
      }
    }
    if (inByte != *pos) {
LAB_002f770d:
      this->pos_ = (uint8_t *)0x0;
      return USTRINGTRIE_NO_MATCH;
    }
    pos = pbVar6 + 2;
    iVar5 = bVar1 - 0x11;
  } while( true );
}

Assistant:

UStringTrieResult
BytesTrie::next(const char *s, int32_t sLength) {
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input byte, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t inByte;
        if(sLength<0) {
            for(;;) {
                if((inByte=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                inByte=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        for(;;) {
            int32_t node=*pos++;
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, inByte);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input byte, if there is one.
                if(sLength<0) {
                    if((inByte=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    inByte=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching bytes.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
            } else if(node<kMinValueLead) {
                // Match length+1 bytes.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(inByte!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching bytes.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipValue(pos, node);
                // The next node must not also be a value node.
                U_ASSERT(*pos<kMinValueLead);
            }
        }
    }
}